

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O1

int32_t __thiscall
icu_63::UCharCharacterIterator::move32(UCharCharacterIterator *this,int32_t delta,EOrigin origin)

{
  char16_t *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int32_t iVar6;
  
  if (origin == kEnd) {
    (this->super_CharacterIterator).pos = (this->super_CharacterIterator).end;
    if (delta < 0) {
      iVar6 = (this->super_CharacterIterator).pos;
      iVar2 = (this->super_CharacterIterator).begin;
      pcVar1 = this->text;
      iVar3 = 1 - delta;
      do {
        if (iVar6 <= iVar2) break;
        iVar4 = iVar6 + -1;
        (this->super_CharacterIterator).pos = iVar4;
        if (((iVar2 < iVar4) && ((pcVar1[(long)iVar6 + -1] & 0xfc00U) == 0xdc00)) &&
           ((pcVar1[(long)iVar6 + -2] & 0xfc00U) == 0xd800)) {
          (this->super_CharacterIterator).pos = iVar6 + -2;
          iVar4 = iVar6 + -2;
        }
        iVar6 = iVar4;
        iVar3 = iVar3 + -1;
      } while (1 < iVar3);
    }
  }
  else if (origin == kCurrent) {
    if (delta < 1) {
      if (delta < 0) {
        iVar6 = (this->super_CharacterIterator).pos;
        iVar2 = (this->super_CharacterIterator).begin;
        pcVar1 = this->text;
        iVar3 = 1 - delta;
        do {
          if (iVar6 <= iVar2) break;
          iVar4 = iVar6 + -1;
          (this->super_CharacterIterator).pos = iVar4;
          if (((iVar2 < iVar4) && ((pcVar1[(long)iVar6 + -1] & 0xfc00U) == 0xdc00)) &&
             ((pcVar1[(long)iVar6 + -2] & 0xfc00U) == 0xd800)) {
            (this->super_CharacterIterator).pos = iVar6 + -2;
            iVar4 = iVar6 + -2;
          }
          iVar6 = iVar4;
          iVar3 = iVar3 + -1;
        } while (1 < iVar3);
      }
    }
    else {
      iVar2 = (this->super_CharacterIterator).pos;
      iVar3 = (this->super_CharacterIterator).end;
      pcVar1 = this->text;
      iVar4 = delta + 1;
      do {
        if ((iVar3 <= iVar2) && ((-1 < iVar3 || (pcVar1[iVar2] == L'\0')))) break;
        iVar5 = iVar2 + 1;
        (this->super_CharacterIterator).pos = iVar5;
        if (((pcVar1[iVar2] & 0xfc00U) == 0xd800) &&
           ((iVar5 != iVar3 && ((pcVar1[iVar5] & 0xfc00U) == 0xdc00)))) {
          (this->super_CharacterIterator).pos = iVar2 + 2;
          iVar5 = iVar2 + 2;
        }
        iVar2 = iVar5;
        iVar4 = iVar4 + -1;
      } while (1 < iVar4);
    }
  }
  else if ((origin == kStart) &&
          ((this->super_CharacterIterator).pos = (this->super_CharacterIterator).begin, 0 < delta))
  {
    iVar2 = (this->super_CharacterIterator).pos;
    iVar3 = (this->super_CharacterIterator).end;
    pcVar1 = this->text;
    iVar4 = delta + 1;
    do {
      if ((iVar3 <= iVar2) && ((-1 < iVar3 || (pcVar1[iVar2] == L'\0')))) break;
      iVar5 = iVar2 + 1;
      (this->super_CharacterIterator).pos = iVar5;
      if (((pcVar1[iVar2] & 0xfc00U) == 0xd800) &&
         ((iVar5 != iVar3 && ((pcVar1[iVar5] & 0xfc00U) == 0xdc00)))) {
        (this->super_CharacterIterator).pos = iVar2 + 2;
        iVar5 = iVar2 + 2;
      }
      iVar2 = iVar5;
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
  }
  return (this->super_CharacterIterator).pos;
}

Assistant:

int32_t
UCharCharacterIterator::move32(int32_t delta, CharacterIterator::EOrigin origin) {
    // this implementation relies on the "safe" version of the UTF macros
    // (or the trustworthiness of the caller)
    switch(origin) {
    case kStart:
        pos = begin;
        if(delta > 0) {
            U16_FWD_N(text, pos, end, delta);
        }
        break;
    case kCurrent:
        if(delta > 0) {
            U16_FWD_N(text, pos, end, delta);
        } else {
            U16_BACK_N(text, begin, pos, -delta);
        }
        break;
    case kEnd:
        pos = end;
        if(delta < 0) {
            U16_BACK_N(text, begin, pos, -delta);
        }
        break;
    default:
        break;
    }

    return pos;
}